

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

void __thiscall QFileSystemModel::setNameFilterDisables(QFileSystemModel *this,bool enable)

{
  byte bVar1;
  QFileSystemModelPrivate *pQVar2;
  byte in_SIL;
  QFileSystemModelPrivate *d;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  pQVar2 = d_func((QFileSystemModel *)0xaa9640);
  if ((pQVar2->nameFilterDisables & 1U) != (bVar1 & 1)) {
    pQVar2->nameFilterDisables = (bool)(bVar1 & 1);
    pQVar2->forceSort = true;
    QFileSystemModelPrivate::delayedSort
              ((QFileSystemModelPrivate *)CONCAT17(bVar1,in_stack_fffffffffffffff0));
  }
  return;
}

Assistant:

void QFileSystemModel::setNameFilterDisables(bool enable)
{
    Q_D(QFileSystemModel);
    if (d->nameFilterDisables == enable)
        return;
    d->nameFilterDisables = enable;
    d->forceSort = true;
    d->delayedSort();
}